

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O3

void __thiscall
BlindFactor_Constractor_hex_empty_Test::TestBody(BlindFactor_Constractor_hex_empty_Test *this)

{
  bool bVar1;
  BlindFactor blind_factor;
  AssertHelper local_58 [4];
  BlindFactor local_38;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_58[0].data_ = (AssertHelperData *)(local_58 + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
    cfd::core::BlindFactor::BlindFactor(&local_38,(string *)local_58);
    if (local_58[0].data_ != (AssertHelperData *)(local_58 + 2)) {
      operator_delete(local_58[0].data_);
    }
    local_38._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_004e1350;
    if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            (local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_blindfactor.cpp"
             ,0x1c,
             "Expected: BlindFactor blind_factor(\"\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_58,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(local_58);
  if (local_38._vptr_BlindFactor != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_38._vptr_BlindFactor != (_func_int **)0x0)) {
      (**(code **)(*local_38._vptr_BlindFactor + 8))();
    }
  }
  return;
}

Assistant:

TEST(BlindFactor, Constractor_hex_empty) {
  EXPECT_THROW(BlindFactor blind_factor(""), CfdException);
}